

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS
ref_part_bin_ugrid_pack_cell
          (FILE *file,REF_BOOL swap_endian,REF_BOOL sixty_four_bit,REF_FILEPOS conn_offset,
          REF_FILEPOS faceid_offset,REF_INT section_size,REF_LONG ncell_read,REF_INT node_per,
          REF_INT size_per,REF_GLOB *c2n)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  void *__ptr;
  ulong uVar4;
  undefined8 uVar5;
  REF_GLOB *pRVar6;
  long *plVar7;
  ulong uVar8;
  void *pvVar9;
  char *pcVar10;
  REF_STATUS RVar11;
  uint uVar12;
  long lVar13;
  size_t sVar14;
  
  uVar12 = node_per * section_size;
  if (sixty_four_bit == 0) {
    if (-1 < (int)uVar12) {
      uVar8 = (ulong)uVar12;
      __ptr = malloc(uVar8 * 4);
      if (__ptr == (void *)0x0) {
        pcVar10 = "malloc c2t of REF_INT NULL";
        uVar5 = 0x454;
        goto LAB_0020a15c;
      }
      lVar13 = (long)node_per;
      iVar3 = fseeko((FILE *)file,conn_offset + ncell_read * lVar13 * 4,0);
      if (iVar3 != 0) {
        uVar5 = 0x458;
        goto LAB_00209f92;
      }
      sVar14 = fread(__ptr,4,uVar8,(FILE *)file);
      if (sVar14 != uVar8) {
        pcVar10 = "cn";
        uVar5 = 0x45b;
        goto LAB_00209f95;
      }
      if (uVar12 != 0) {
        uVar4 = 0;
        do {
          if (swap_endian != 0) {
            uVar12 = *(uint *)((long)__ptr + uVar4 * 4);
            *(uint *)((long)__ptr + uVar4 * 4) =
                 uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18
            ;
          }
          uVar4 = uVar4 + 1;
        } while (uVar8 != uVar4);
      }
      if (0 < section_size) {
        uVar8 = 0;
        pvVar9 = __ptr;
        pRVar6 = c2n;
        do {
          if (0 < node_per) {
            uVar4 = 0;
            do {
              pRVar6[uVar4] = (long)*(int *)((long)pvVar9 + uVar4 * 4) + -1;
              uVar4 = uVar4 + 1;
            } while ((uint)node_per != uVar4);
          }
          uVar8 = uVar8 + 1;
          pRVar6 = pRVar6 + size_per;
          pvVar9 = (void *)((long)pvVar9 + lVar13 * 4);
        } while (uVar8 != (uint)section_size);
      }
      RVar11 = 1;
      if (node_per != size_per) {
        if (section_size < 0) {
          pcVar10 = "malloc tag of REF_INT negative";
          uVar5 = 0x466;
        }
        else {
          uVar8 = (ulong)(uint)section_size;
          pvVar9 = malloc(uVar8 * 4);
          if (pvVar9 == (void *)0x0) {
            pcVar10 = "malloc tag of REF_INT NULL";
            uVar5 = 0x466;
            goto LAB_0020a428;
          }
          iVar3 = fseeko((FILE *)file,faceid_offset + ncell_read * 4,0);
          if (iVar3 != 0) {
            uVar5 = 0x46a;
            goto LAB_0020a285;
          }
          sVar14 = fread(pvVar9,4,uVar8,(FILE *)file);
          if (sVar14 == uVar8) {
            if (section_size != 0) {
              uVar4 = 0;
              do {
                if (swap_endian != 0) {
                  uVar12 = *(uint *)((long)pvVar9 + uVar4 * 4);
                  *(uint *)((long)pvVar9 + uVar4 * 4) =
                       uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                       uVar12 << 0x18;
                }
                uVar4 = uVar4 + 1;
              } while (uVar8 != uVar4);
              uVar8 = 1;
              if (1 < section_size) {
                uVar8 = (ulong)(uint)section_size;
              }
              plVar7 = c2n + lVar13;
              uVar4 = 0;
              do {
                *plVar7 = (long)*(int *)((long)pvVar9 + uVar4 * 4);
                uVar4 = uVar4 + 1;
                plVar7 = plVar7 + size_per;
              } while (uVar8 != uVar4);
            }
            goto LAB_0020a4b1;
          }
          pcVar10 = "tag";
          uVar5 = 0x46c;
        }
        goto LAB_0020a50b;
      }
LAB_0020a51c:
      free(__ptr);
      bVar2 = true;
      goto LAB_0020a2c4;
    }
    pcVar10 = "malloc c2t of REF_INT negative";
    uVar5 = 0x454;
LAB_0020a2b7:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar5,
           "ref_part_bin_ugrid_pack_cell",pcVar10);
  }
  else {
    if ((int)uVar12 < 0) {
      pcVar10 = "malloc c2t of REF_LONG negative";
      uVar5 = 0x430;
      goto LAB_0020a2b7;
    }
    uVar8 = (ulong)uVar12;
    __ptr = malloc(uVar8 * 8);
    if (__ptr == (void *)0x0) {
      pcVar10 = "malloc c2t of REF_LONG NULL";
      uVar5 = 0x430;
LAB_0020a15c:
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar5,
             "ref_part_bin_ugrid_pack_cell",pcVar10);
      RVar11 = 2;
      goto LAB_0020a2c4;
    }
    lVar13 = (long)node_per;
    iVar3 = fseeko((FILE *)file,conn_offset + ncell_read * lVar13 * 8,0);
    if (iVar3 == 0) {
      sVar14 = fread(__ptr,8,uVar8,(FILE *)file);
      if (sVar14 != uVar8) {
        pcVar10 = "cn";
        uVar5 = 0x437;
        goto LAB_0020a2b7;
      }
      if (uVar12 != 0) {
        uVar4 = 0;
        do {
          if (swap_endian != 0) {
            uVar1 = *(ulong *)((long)__ptr + uVar4 * 8);
            *(ulong *)((long)__ptr + uVar4 * 8) =
                 uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                 (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                 (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
                 uVar1 << 0x38;
          }
          uVar4 = uVar4 + 1;
        } while (uVar8 != uVar4);
      }
      if (0 < section_size) {
        uVar8 = 0;
        pvVar9 = __ptr;
        pRVar6 = c2n;
        do {
          if (0 < node_per) {
            uVar4 = 0;
            do {
              pRVar6[uVar4] = *(long *)((long)pvVar9 + uVar4 * 8) + -1;
              uVar4 = uVar4 + 1;
            } while ((uint)node_per != uVar4);
          }
          uVar8 = uVar8 + 1;
          pRVar6 = pRVar6 + size_per;
          pvVar9 = (void *)((long)pvVar9 + lVar13 * 8);
        } while (uVar8 != (uint)section_size);
      }
      RVar11 = 1;
      if (node_per == size_per) goto LAB_0020a51c;
      if (section_size < 0) {
        pcVar10 = "malloc tag of REF_LONG negative";
        uVar5 = 0x442;
LAB_0020a50b:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar5,"ref_part_bin_ugrid_pack_cell",pcVar10);
LAB_0020a512:
        bVar2 = false;
        RVar11 = 1;
      }
      else {
        uVar8 = (ulong)(uint)section_size;
        pvVar9 = malloc(uVar8 * 8);
        if (pvVar9 == (void *)0x0) {
          pcVar10 = "malloc tag of REF_LONG NULL";
          uVar5 = 0x442;
LAB_0020a428:
          bVar2 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar5,"ref_part_bin_ugrid_pack_cell",pcVar10);
          RVar11 = 2;
        }
        else {
          iVar3 = fseeko((FILE *)file,faceid_offset + ncell_read * 8,0);
          if (iVar3 != 0) {
            uVar5 = 0x446;
LAB_0020a285:
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar5,"ref_part_bin_ugrid_pack_cell","seek tag failed",0,(long)iVar3);
            goto LAB_0020a512;
          }
          sVar14 = fread(pvVar9,8,uVar8,(FILE *)file);
          if (sVar14 != uVar8) {
            pcVar10 = "tag";
            uVar5 = 0x448;
            goto LAB_0020a50b;
          }
          if (section_size != 0) {
            uVar4 = 0;
            do {
              if (swap_endian != 0) {
                uVar1 = *(ulong *)((long)pvVar9 + uVar4 * 8);
                *(ulong *)((long)pvVar9 + uVar4 * 8) =
                     uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                     (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                     (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                     (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
              }
              uVar4 = uVar4 + 1;
            } while (uVar8 != uVar4);
            uVar8 = 1;
            if (1 < section_size) {
              uVar8 = (ulong)(uint)section_size;
            }
            pRVar6 = c2n + lVar13;
            uVar4 = 0;
            do {
              *pRVar6 = *(REF_GLOB *)((long)pvVar9 + uVar4 * 8);
              uVar4 = uVar4 + 1;
              pRVar6 = pRVar6 + size_per;
            } while (uVar8 != uVar4);
          }
LAB_0020a4b1:
          free(pvVar9);
          RVar11 = 1;
          bVar2 = true;
        }
      }
      if (!bVar2) {
        bVar2 = false;
        goto LAB_0020a2c4;
      }
      goto LAB_0020a51c;
    }
    uVar5 = 0x434;
LAB_00209f92:
    sVar14 = (size_t)iVar3;
    pcVar10 = "seek conn failed";
    uVar8 = 0;
LAB_00209f95:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar5,
           "ref_part_bin_ugrid_pack_cell",pcVar10,uVar8,sVar14);
  }
  bVar2 = false;
  RVar11 = 1;
LAB_0020a2c4:
  if (bVar2) {
    RVar11 = 0;
  }
  return RVar11;
}

Assistant:

REF_FCN static REF_STATUS ref_part_bin_ugrid_pack_cell(
    FILE *file, REF_BOOL swap_endian, REF_BOOL sixty_four_bit,
    REF_FILEPOS conn_offset, REF_FILEPOS faceid_offset, REF_INT section_size,
    REF_LONG ncell_read, REF_INT node_per, REF_INT size_per, REF_GLOB *c2n) {
  REF_INT cell, node;
  REF_FILEPOS ibyte;
  ibyte = (sixty_four_bit ? 8 : 4);

  if (sixty_four_bit) {
    REF_LONG *c2t;
    ref_malloc(c2t, node_per * section_size, REF_LONG);
    REIS(0,
         fseeko(file, conn_offset + ibyte * node_per * (REF_FILEPOS)ncell_read,
                SEEK_SET),
         "seek conn failed");
    RES((size_t)(section_size * node_per),
        fread(c2t, sizeof(REF_LONG), (size_t)(section_size * node_per), file),
        "cn");
    for (cell = 0; cell < section_size * node_per; cell++) {
      if (swap_endian) SWAP_LONG(c2t[cell]);
    }
    for (cell = 0; cell < section_size; cell++) {
      for (node = 0; node < node_per; node++) {
        c2n[node + size_per * cell] = c2t[node + node_per * cell] - 1;
      }
    }
    if (node_per != size_per) {
      REF_LONG *tag;
      ref_malloc(tag, section_size, REF_LONG);
      REIS(0,
           fseeko(file, faceid_offset + ibyte * (REF_FILEPOS)ncell_read,
                  SEEK_SET),
           "seek tag failed");
      RES((size_t)(section_size),
          fread(tag, sizeof(REF_LONG), (size_t)section_size, file), "tag");
      for (cell = 0; cell < section_size; cell++) {
        if (swap_endian) SWAP_LONG(tag[cell]);
      }
      /* sort into right locations */
      for (cell = 0; cell < section_size; cell++)
        c2n[node_per + cell * size_per] = tag[cell];
      ref_free(tag);
    }
    ref_free(c2t);
  } else {
    REF_INT *c2t;
    ref_malloc(c2t, node_per * section_size, REF_INT);
    REIS(0,
         fseeko(file, conn_offset + ibyte * node_per * (REF_FILEPOS)ncell_read,
                SEEK_SET),
         "seek conn failed");
    REIS((size_t)(section_size * node_per),
         fread(c2t, sizeof(REF_INT), (size_t)(section_size * node_per), file),
         "cn");
    for (cell = 0; cell < section_size * node_per; cell++) {
      if (swap_endian) SWAP_INT(c2t[cell]);
    }
    for (cell = 0; cell < section_size; cell++) {
      for (node = 0; node < node_per; node++) {
        c2n[node + size_per * cell] = c2t[node + node_per * cell] - 1;
      }
    }
    if (node_per != size_per) {
      REF_INT *tag;
      ref_malloc(tag, section_size, REF_INT);
      REIS(0,
           fseeko(file, faceid_offset + ibyte * (REF_FILEPOS)ncell_read,
                  SEEK_SET),
           "seek tag failed");
      RES((size_t)(section_size),
          fread(tag, sizeof(REF_INT), (size_t)section_size, file), "tag");
      for (cell = 0; cell < section_size; cell++) {
        if (swap_endian) SWAP_INT(tag[cell]);
      }
      /* sort into right locations */
      for (cell = 0; cell < section_size; cell++)
        c2n[node_per + cell * size_per] = tag[cell];
      ref_free(tag);
    }
    ref_free(c2t);
  }
  return REF_SUCCESS;
}